

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFindPackageCommand.cxx
# Opt level: O1

bool __thiscall
cmFileListGeneratorBase::Consider
          (cmFileListGeneratorBase *this,string *fullPath,cmFileList *listing)

{
  cmFileListGeneratorBase *pcVar1;
  pointer pcVar2;
  undefined1 uVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  long *local_40 [2];
  long local_30 [2];
  int iVar4;
  
  pcVar1 = (this->Next)._M_t.
           super___uniq_ptr_impl<cmFileListGeneratorBase,_std::default_delete<cmFileListGeneratorBase>_>
           ._M_t.
           super__Tuple_impl<0UL,_cmFileListGeneratorBase_*,_std::default_delete<cmFileListGeneratorBase>_>
           .super__Head_base<0UL,_cmFileListGeneratorBase_*,_false>._M_head_impl;
  if (pcVar1 == (cmFileListGeneratorBase *)0x0) {
    pcVar2 = (fullPath->_M_dataplus)._M_p;
    local_40[0] = local_30;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_40,pcVar2,pcVar2 + fullPath->_M_string_length);
    std::__cxx11::string::append((char *)local_40);
    iVar4 = (*listing->_vptr_cmFileList[2])(listing,local_40);
    uVar3 = (undefined1)iVar4;
    if (local_40[0] == local_30) {
      return (bool)uVar3;
    }
  }
  else {
    pcVar2 = (fullPath->_M_dataplus)._M_p;
    local_40[0] = local_30;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_40,pcVar2,pcVar2 + fullPath->_M_string_length);
    std::__cxx11::string::append((char *)local_40);
    iVar4 = (*pcVar1->_vptr_cmFileListGeneratorBase[2])(pcVar1,local_40,listing);
    uVar3 = (undefined1)iVar4;
    if (local_40[0] == local_30) {
      return (bool)uVar3;
    }
  }
  operator_delete(local_40[0],local_30[0] + 1);
  return (bool)uVar3;
}

Assistant:

bool cmFileListGeneratorBase::Consider(std::string const& fullPath,
                                       cmFileList& listing)
{
  if (this->Next) {
    return this->Next->Search(fullPath + "/", listing);
  }
  return listing.Visit(fullPath + "/");
}